

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketExtensions.h
# Opt level: O0

void __thiscall
uWS::ExtensionsParser::ExtensionsParser(ExtensionsParser *this,char *data,size_t length)

{
  ExtensionsParser *this_00;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int token;
  char *stop;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  this_00 = (ExtensionsParser *)(in_RSI + in_RDX);
  for (iVar1 = 1; iVar1 != 0 && iVar1 != 0x72e;
      iVar1 = getToken(this_00,(char **)CONCAT44(iVar1,in_stack_ffffffffffffffd8),(char *)in_RDI)) {
  }
  *(bool *)(in_RDI + 1) = iVar1 == 0x72e;
  while ((iVar1 = getToken(this_00,(char **)CONCAT44(iVar1,in_stack_ffffffffffffffd8),(char *)in_RDI
                          ), iVar1 != 0 && (iVar1 != 0x72e))) {
    if (iVar1 == 0x92c) {
      *(undefined4 *)(in_RDI + 2) = 1;
      *in_RDI = (long)(in_RDI + 2);
    }
    else if (iVar1 == 0x944) {
      *(undefined4 *)((long)in_RDI + 0xc) = 1;
      *in_RDI = (long)in_RDI + 0xc;
    }
    else if (iVar1 == 0xadf) {
      *(undefined1 *)((long)in_RDI + 10) = 1;
    }
    else if (iVar1 == 0xaf7) {
      *(undefined1 *)((long)in_RDI + 9) = 1;
    }
    else if ((iVar1 < 0) && (*in_RDI != 0)) {
      *(int *)*in_RDI = -iVar1;
    }
  }
  return;
}

Assistant:

ExtensionsParser(const char *data, size_t length) {
        const char *stop = data + length;
        int token = 1;
        for (; token && token != TOK_PERMESSAGE_DEFLATE; token = getToken(data, stop));

        perMessageDeflate = (token == TOK_PERMESSAGE_DEFLATE);
        while ((token = getToken(data, stop))) {
            switch (token) {
            case TOK_PERMESSAGE_DEFLATE:
                return;
            case TOK_SERVER_NO_CONTEXT_TAKEOVER:
                serverNoContextTakeover = true;
                break;
            case TOK_CLIENT_NO_CONTEXT_TAKEOVER:
                clientNoContextTakeover = true;
                break;
            case TOK_SERVER_MAX_WINDOW_BITS:
                serverMaxWindowBits = 1;
                lastInteger = &serverMaxWindowBits;
                break;
            case TOK_CLIENT_MAX_WINDOW_BITS:
                clientMaxWindowBits = 1;
                lastInteger = &clientMaxWindowBits;
                break;
            default:
                if (token < 0 && lastInteger) {
                    *lastInteger = -token;
                }
                break;
            }
        }
    }